

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal-inl.h
# Opt level: O1

void __thiscall
testing::internal::StreamingListener::OnTestEnd(StreamingListener *this,TestInfo *test_info)

{
  undefined8 *puVar1;
  bool bVar2;
  long *plVar3;
  undefined8 *puVar4;
  long *plVar5;
  ulong *puVar6;
  size_type *psVar7;
  char *pcVar8;
  char *pcVar9;
  ulong uVar10;
  undefined8 uVar11;
  undefined8 *local_f8;
  undefined8 local_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  ulong *local_d8;
  long local_d0;
  ulong local_c8;
  long lStack_c0;
  string local_b8;
  long *local_98;
  long local_90;
  long local_88;
  long lStack_80;
  TimeInMillis local_78;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  string local_50;
  
  bVar2 = TestResult::Failed(&test_info->result_);
  pcVar9 = "1";
  if (bVar2) {
    pcVar9 = "0";
  }
  local_70[0] = local_60;
  pcVar8 = "";
  if (bVar2) {
    pcVar8 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,pcVar9,pcVar8);
  plVar3 = (long *)std::__cxx11::string::replace((ulong)local_70,0,(char *)0x0,0x27c570);
  plVar5 = plVar3 + 2;
  if ((long *)*plVar3 == plVar5) {
    local_88 = *plVar5;
    lStack_80 = plVar3[3];
    local_98 = &local_88;
  }
  else {
    local_88 = *plVar5;
    local_98 = (long *)*plVar3;
  }
  local_90 = plVar3[1];
  *plVar3 = (long)plVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_98);
  puVar6 = (ulong *)(plVar3 + 2);
  if ((ulong *)*plVar3 == puVar6) {
    local_c8 = *puVar6;
    lStack_c0 = plVar3[3];
    local_d8 = &local_c8;
  }
  else {
    local_c8 = *puVar6;
    local_d8 = (ulong *)*plVar3;
  }
  local_d0 = plVar3[1];
  *plVar3 = (long)puVar6;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  local_78 = (test_info->result_).elapsed_time_;
  StreamableToString<long_long>(&local_b8,&local_78);
  uVar10 = 0xf;
  if (local_d8 != &local_c8) {
    uVar10 = local_c8;
  }
  if (uVar10 < local_b8._M_string_length + local_d0) {
    uVar11 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      uVar11 = local_b8.field_2._M_allocated_capacity;
    }
    if (local_b8._M_string_length + local_d0 <= (ulong)uVar11) {
      puVar4 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_b8,0,(char *)0x0,(ulong)local_d8);
      goto LAB_00215972;
    }
  }
  puVar4 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_d8,(ulong)local_b8._M_dataplus._M_p);
LAB_00215972:
  local_f8 = &local_e8;
  puVar1 = puVar4 + 2;
  if ((undefined8 *)*puVar4 == puVar1) {
    local_e8 = *puVar1;
    uStack_e0 = puVar4[3];
  }
  else {
    local_e8 = *puVar1;
    local_f8 = (undefined8 *)*puVar4;
  }
  local_f0 = puVar4[1];
  *puVar4 = puVar1;
  puVar4[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_f8);
  psVar7 = (size_type *)(plVar3 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar3 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar7) {
    local_50.field_2._M_allocated_capacity = *psVar7;
    local_50.field_2._8_8_ = plVar3[3];
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  }
  else {
    local_50.field_2._M_allocated_capacity = *psVar7;
    local_50._M_dataplus._M_p = (pointer)*plVar3;
  }
  local_50._M_string_length = plVar3[1];
  *plVar3 = (long)psVar7;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  AbstractSocketWriter::SendLn((this->socket_writer_).ptr_,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if (local_f8 != &local_e8) {
    operator_delete(local_f8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  if (local_d8 != &local_c8) {
    operator_delete(local_d8);
  }
  if (local_98 != &local_88) {
    operator_delete(local_98);
  }
  if (local_70[0] != local_60) {
    operator_delete(local_70[0]);
  }
  return;
}

Assistant:

void OnTestEnd(const TestInfo& test_info) {
    SendLn("event=TestEnd&passed=" +
           FormatBool((test_info.result())->Passed()) +
           "&elapsed_time=" +
           StreamableToString((test_info.result())->elapsed_time()) + "ms");
  }